

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::calculateabovepoint4(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  double dVar1;
  double __x;
  double len2;
  double len1;
  double len;
  double *norm;
  double n2 [3];
  double local_48;
  double n1 [3];
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  n1[2] = (double)pd;
  facenormal(this,pa,pb,pc,&local_48,1,(double *)0x0);
  dVar1 = dot(this,&local_48,&local_48);
  dVar1 = sqrt(dVar1);
  facenormal(this,pa,pb,(point)n1[2],(double *)&norm,1,(double *)0x0);
  __x = dot(this,(double *)&norm,(double *)&norm);
  len1 = sqrt(__x);
  if (dVar1 <= len1) {
    len = (double)&norm;
  }
  else {
    len = (double)&local_48;
    len1 = dVar1;
  }
  *(double *)len = *(double *)len / len1;
  *(double *)((long)len + 8) = *(double *)((long)len + 8) / len1;
  *(double *)((long)len + 0x10) = *(double *)((long)len + 0x10) / len1;
  dVar1 = distance(this,pa,pb);
  *this->dummypoint = dVar1 * *(double *)len + *pa;
  this->dummypoint[1] = dVar1 * *(double *)((long)len + 8) + pa[1];
  this->dummypoint[2] = dVar1 * *(double *)((long)len + 0x10) + pa[2];
  return;
}

Assistant:

void tetgenmesh::calculateabovepoint4(point pa, point pb, point pc, point pd)
{
  REAL n1[3], n2[3], *norm;
  REAL len, len1, len2;

  // Select a base.
  facenormal(pa, pb, pc, n1, 1, NULL);
  len1 = sqrt(dot(n1, n1));
  facenormal(pa, pb, pd, n2, 1, NULL);
  len2 = sqrt(dot(n2, n2));
  if (len1 > len2) {
    norm = n1;
    len = len1;
  } else {
    norm = n2;
    len = len2;
  }
  norm[0] /= len;
  norm[1] /= len;
  norm[2] /= len;
  len = distance(pa, pb);
  dummypoint[0] = pa[0] + len * norm[0];
  dummypoint[1] = pa[1] + len * norm[1];
  dummypoint[2] = pa[2] + len * norm[2];
}